

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.cpp
# Opt level: O3

void InitParametersFromDefinitions
               (InternalEffectDefinitionRegistrationCallback registereffectdefcallback,float *params
               )

{
  UInt32 UVar1;
  long lVar2;
  ulong uVar3;
  UnityAudioEffectDefinition definition;
  UnityAudioEffectDefinition local_a0;
  
  memset(&local_a0,0,0x88);
  (*registereffectdefcallback)(&local_a0);
  if (local_a0.numparameters != 0) {
    lVar2 = 0xc;
    uVar3 = 0;
    UVar1 = local_a0.numparameters;
    do {
      params[uVar3] = *(float *)((local_a0.paramdefs)->name + lVar2 * 4);
      if (*(void **)((local_a0.paramdefs)->name + lVar2 * 4 + -0x10) != (void *)0x0) {
        operator_delete__(*(void **)((local_a0.paramdefs)->name + lVar2 * 4 + -0x10));
        UVar1 = local_a0.numparameters;
      }
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x10;
    } while (uVar3 < UVar1);
  }
  if (local_a0.paramdefs != (UnityAudioParameterDefinition *)0x0) {
    operator_delete__(local_a0.paramdefs);
  }
  return;
}

Assistant:

void InitParametersFromDefinitions(
    InternalEffectDefinitionRegistrationCallback registereffectdefcallback,
    float* params
    )
{
    UnityAudioEffectDefinition definition;
    memset(&definition, 0, sizeof(definition));
    registereffectdefcallback(definition);
    for (UInt32 n = 0; n < definition.numparameters; n++)
    {
        params[n] = definition.paramdefs[n].defaultval;
        delete[] definition.paramdefs[n].description;
    }
    delete[] definition.paramdefs; // assumes that definition.paramdefs was allocated by registereffectdefcallback or is NULL
}